

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O3

bool __thiscall gl4cts::DirectStateAccess::Framebuffers::BlitTest::CheckColor(BlitTest *this)

{
  ostringstream *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  deUint32 err;
  undefined4 extraout_var;
  GLfloat (*paGVar4) [4];
  undefined8 **ppuVar5;
  long lVar6;
  long lVar7;
  float fVar8;
  GLfloat color [2] [3] [4];
  undefined8 *local_228 [2];
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  float local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_228[0] = &local_218;
  local_1c8 = 0;
  uStack_1c0 = 0;
  local_1d8 = 0;
  uStack_1d0 = 0;
  local_1e8 = 0;
  uStack_1e0 = 0;
  local_1f8 = 0;
  uStack_1f0 = 0;
  local_208 = 0;
  uStack_200 = 0;
  local_218 = 0;
  uStack_210 = 0;
  lVar6 = 0;
  (**(code **)(CONCAT44(extraout_var,iVar3) + 0x1220))(0,0,3,2,0x1908,0x1406);
  err = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
  glu::checkError(err,"glReadPixels has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xb5b);
  this_00 = (ostringstream *)(local_1a0 + 8);
  bVar2 = true;
  do {
    paGVar4 = CheckColor::reference[lVar6];
    ppuVar5 = local_228 + lVar6 * 6;
    lVar6 = 0;
    do {
      ppuVar5 = ppuVar5 + 2;
      lVar7 = 0;
      do {
        fVar8 = (*(GLfloat (*) [4])*paGVar4)[lVar7] - *(float *)((long)ppuVar5 + lVar7 * 4);
        local_1b8 = -fVar8;
        if (-fVar8 <= fVar8) {
          local_1b8 = fVar8;
        }
        if (0.015625 < local_1b8) {
          uStack_1b4 = 0x80000000;
          uStack_1b0 = 0x80000000;
          uStack_1ac = 0x80000000;
          local_1a0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream(this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,"Blitted framebuffer color buffer contains [[",0x2c);
          std::ostream::_M_insert<double>((double)(float)local_218);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>((double)local_218._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>((double)(float)uStack_210);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>((double)uStack_210._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"], [",4);
          std::ostream::_M_insert<double>((double)(float)local_208);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>((double)local_208._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>((double)(float)uStack_200);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>((double)uStack_200._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"], [",4);
          std::ostream::_M_insert<double>((double)(float)local_1f8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>((double)local_1f8._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>((double)(float)uStack_1f0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>((double)uStack_1f0._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"],\n[",4);
          std::ostream::_M_insert<double>((double)(float)local_1e8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>((double)local_1e8._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>((double)(float)uStack_1e0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>((double)uStack_1e0._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"], [",4);
          std::ostream::_M_insert<double>((double)(float)local_1d8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>((double)local_1d8._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>((double)(float)uStack_1d0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>((double)uStack_1d0._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"], [",4);
          std::ostream::_M_insert<double>((double)(float)local_1c8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>((double)local_1c8._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>((double)(float)uStack_1c0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>((double)uStack_1c0._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]], but\n",8);
          std::ostream::_M_insert<double>(1.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>(0.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>(0.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>(1.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"], [",4);
          std::ostream::_M_insert<double>(0.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>(1.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>(0.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>(1.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"], [",4);
          std::ostream::_M_insert<double>(0.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>(0.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>(1.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>(1.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"],\n[",4);
          std::ostream::_M_insert<double>(1.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>(1.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>(0.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>(1.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"], [",4);
          std::ostream::_M_insert<double>(1.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>(1.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>(0.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>(1.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"], [",4);
          std::ostream::_M_insert<double>(1.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>(1.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>(0.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>(1.0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,"]] was expected.\n",0x11);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(this_00);
          std::ios_base::~ios_base(local_128);
          goto LAB_00a916a6;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      lVar6 = lVar6 + 1;
      paGVar4 = paGVar4 + 1;
    } while (lVar6 != 3);
    lVar6 = 1;
    bVar1 = !bVar2;
    bVar2 = false;
    if (bVar1) {
LAB_00a916a6:
      return local_1b8 <= 0.015625;
    }
  } while( true );
}

Assistant:

bool BlitTest::CheckColor()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reference values. */
	static const glw::GLfloat reference[2][3][4] = {
		{ { 1.f, 0.f, 0.f, 1.f }, { 0.f, 1.f, 0.f, 1.f }, { 0.f, 0.f, 1.f, 1.f } },
		{ { 1.f, 1.f, 0.f, 1.f }, { 1.f, 1.f, 0.f, 1.f }, { 1.f, 1.f, 0.f, 1.f } }
	};

	/* Copy buffer. */
	glw::GLfloat color[2][3][4] = { { { 0 } } };

	/* Reading from GL. */
	gl.readPixels(0, 0, 3, 2, GL_RGBA, GL_FLOAT, color);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels has failed");

	/* Comparison against the reference. */
	for (glw::GLuint j = 0; j < 2; ++j)
	{
		for (glw::GLuint i = 0; i < 3; ++i)
		{
			for (glw::GLuint k = 0; k < 4; ++k)
			{
				if (de::abs(reference[j][i][k] - color[j][i][k]) > (1.f / 64.f) /* Precision. */)
				{
					/* Log. */
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "Blitted framebuffer color buffer contains [[" << color[0][0][0]
						<< ", " << color[0][0][1] << ", " << color[0][0][2] << ", " << color[0][0][3] << "], ["
						<< color[0][1][0] << ", " << color[0][1][1] << ", " << color[0][1][2] << ", " << color[0][1][3]
						<< "], [" << color[0][2][0] << ", " << color[0][2][1] << ", " << color[0][2][2] << ", "
						<< color[0][2][3] << "],\n[" << color[1][0][0] << ", " << color[1][0][1] << ", "
						<< color[1][0][2] << ", " << color[1][0][3] << "], [" << color[1][1][0] << ", "
						<< color[1][1][1] << ", " << color[1][1][2] << ", " << color[1][1][3] << "], ["
						<< color[1][2][0] << ", " << color[1][2][1] << ", " << color[1][2][2] << ", " << color[1][2][3]
						<< "]], but\n"
						<< reference[0][0][0] << ", " << reference[0][0][1] << ", " << reference[0][0][2] << ", "
						<< reference[0][0][3] << "], [" << reference[0][1][0] << ", " << reference[0][1][1] << ", "
						<< reference[0][1][2] << ", " << reference[0][1][3] << "], [" << reference[0][2][0] << ", "
						<< reference[0][2][1] << ", " << reference[0][2][2] << ", " << reference[0][2][3] << "],\n["
						<< reference[1][0][0] << ", " << reference[1][0][1] << ", " << reference[1][0][2] << ", "
						<< reference[1][0][3] << "], [" << reference[1][1][0] << ", " << reference[1][1][1] << ", "
						<< reference[1][1][2] << ", " << reference[1][1][3] << "], [" << reference[1][2][0] << ", "
						<< reference[1][2][1] << ", " << reference[1][2][2] << ", " << reference[1][2][3]
						<< "]] was expected.\n"
						<< tcu::TestLog::EndMessage;

					return false;
				}
			}
		}
	}

	return true;
}